

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_write_sine.c
# Opt level: O2

int main(void)

{
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  PaHostErrorInfo *pPVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  double dVar12;
  PaStream *stream;
  int local_237c;
  PaStreamParameters outputParameters;
  float sine [200];
  float buffer [1024] [2];
  
  printf("PortAudio Test: output sine wave. SR = %d, BufSize = %d\n",0xac44,0x400);
  for (lVar7 = 0; lVar7 != 200; lVar7 = lVar7 + 1) {
    dVar12 = ((double)(int)lVar7 / 200.0) * 3.141592653589793;
    dVar12 = sin(dVar12 + dVar12);
    sine[lVar7] = (float)dVar12;
  }
  uVar1 = Pa_Initialize();
  if (uVar1 == 0) {
    outputParameters.device = Pa_GetDefaultOutputDevice();
    if (outputParameters.device == -1) {
      fwrite("Error: No default output device.\n",0x21,1,_stderr);
      uVar11 = 0;
      goto LAB_00106c31;
    }
    outputParameters.channelCount = 2;
    outputParameters.sampleFormat = 1;
    outputParameters.suggestedLatency = 0.05;
    outputParameters.hostApiSpecificStreamInfo = (void *)0x0;
    iVar10 = 0;
    uVar1 = Pa_OpenStream(&stream,(PaStreamParameters *)0x0,&outputParameters,44100.0,0x400,1,
                          (PaStreamCallback *)0x0,(void *)0x0);
    if (uVar1 == 0) {
      puts("Play 3 times, higher each time.");
      iVar8 = 3;
      iVar9 = 0;
      for (iVar6 = 1; iVar6 != 4; iVar6 = iVar6 + 1) {
        uVar1 = Pa_StartStream(stream);
        if (uVar1 != 0) goto LAB_00106c2e;
        printf("Play for %d seconds.\n",5);
        iVar5 = 0;
        while (iVar5 != 0xd7) {
          for (lVar7 = 0; lVar7 != 0x400; lVar7 = lVar7 + 1) {
            buffer[lVar7][0] = sine[iVar10];
            buffer[lVar7][1] = sine[iVar9];
            iVar4 = iVar10 + iVar6;
            iVar10 = iVar4 + -200;
            if (iVar4 < 200) {
              iVar10 = iVar4;
            }
            iVar4 = iVar9 + iVar8;
            iVar9 = iVar4 + -200;
            if (iVar4 < 200) {
              iVar9 = iVar4;
            }
          }
          local_237c = iVar5;
          uVar1 = Pa_WriteStream(stream,buffer,0x400);
          iVar5 = local_237c + 1;
          if (uVar1 != 0) goto LAB_00106c2e;
        }
        uVar1 = Pa_StopStream(stream);
        if (uVar1 != 0) goto LAB_00106c2e;
        iVar8 = iVar8 + 1;
        Pa_Sleep(1000);
      }
      uVar1 = Pa_CloseStream(stream);
      if (uVar1 == 0) {
        Pa_Terminate();
        puts("Test finished.");
        return 0;
      }
    }
  }
LAB_00106c2e:
  uVar11 = (ulong)uVar1;
LAB_00106c31:
  fwrite("An error occured while using the portaudio stream\n",0x32,1,_stderr);
  iVar10 = (int)uVar11;
  fprintf(_stderr,"Error number: %d\n",uVar11);
  __stream = _stderr;
  pcVar2 = Pa_GetErrorText(iVar10);
  fprintf(__stream,"Error message: %s\n",pcVar2);
  if (iVar10 == -9999) {
    pPVar3 = Pa_GetLastHostErrorInfo();
    fprintf(_stderr,"Host API error = #%ld, hostApiType = %d\n",pPVar3->errorCode,
            (ulong)pPVar3->hostApiType);
    fprintf(_stderr,"Host API error = %s\n",pPVar3->errorText);
  }
  Pa_Terminate();
  return iVar10;
}

Assistant:

int main(void)
{
    PaStreamParameters outputParameters;
    PaStream *stream;
    PaError err;
    float buffer[FRAMES_PER_BUFFER][2]; /* stereo output buffer */
    float sine[TABLE_SIZE]; /* sine wavetable */
    int left_phase = 0;
    int right_phase = 0;
    int left_inc = 1;
    int right_inc = 3; /* higher pitch so we can distinguish left and right. */
    int i, j, k;
    int bufferCount;
    
    printf("PortAudio Test: output sine wave. SR = %d, BufSize = %d\n", SAMPLE_RATE, FRAMES_PER_BUFFER);
    
    /* initialise sinusoidal wavetable */
    for( i=0; i<TABLE_SIZE; i++ )
    {
        sine[i] = (float) sin( ((double)i/(double)TABLE_SIZE) * M_PI * 2. );
    }

    
    err = Pa_Initialize();
    if( err != paNoError ) goto error;

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    if (outputParameters.device == paNoDevice) {
      fprintf(stderr,"Error: No default output device.\n");
      goto error;
    }
    outputParameters.channelCount = 2;       /* stereo output */
    outputParameters.sampleFormat = paFloat32; /* 32 bit floating point output */
    outputParameters.suggestedLatency = 0.050; // Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    err = Pa_OpenStream(
              &stream,
              NULL, /* no input */
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              NULL, /* no callback, use blocking API */
              NULL ); /* no callback, so no callback userData */
    if( err != paNoError ) goto error;


    printf( "Play 3 times, higher each time.\n" );
    
    for( k=0; k < 3; ++k )
    {
        err = Pa_StartStream( stream );
        if( err != paNoError ) goto error;

        printf("Play for %d seconds.\n", NUM_SECONDS );

        bufferCount = ((NUM_SECONDS * SAMPLE_RATE) / FRAMES_PER_BUFFER);

        for( i=0; i < bufferCount; i++ )
        {
            for( j=0; j < FRAMES_PER_BUFFER; j++ )
            {
                buffer[j][0] = sine[left_phase];  /* left */
                buffer[j][1] = sine[right_phase];  /* right */
                left_phase += left_inc;
                if( left_phase >= TABLE_SIZE ) left_phase -= TABLE_SIZE;
                right_phase += right_inc;
                if( right_phase >= TABLE_SIZE ) right_phase -= TABLE_SIZE;
            }

            err = Pa_WriteStream( stream, buffer, FRAMES_PER_BUFFER );
            if( err != paNoError ) goto error;
        }   

        err = Pa_StopStream( stream );
        if( err != paNoError ) goto error;

        ++left_inc;
        ++right_inc;

        Pa_Sleep( 1000 );
    }

    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto error;

    Pa_Terminate();
    printf("Test finished.\n");
    
    return err;

error:
    fprintf( stderr, "An error occured while using the portaudio stream\n" );
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
	// Print more information about the error.
	if( err == paUnanticipatedHostError )
	{
		const PaHostErrorInfo *hostErrorInfo = Pa_GetLastHostErrorInfo();
		fprintf( stderr, "Host API error = #%ld, hostApiType = %d\n", hostErrorInfo->errorCode, hostErrorInfo->hostApiType );
		fprintf( stderr, "Host API error = %s\n", hostErrorInfo->errorText );
	}
    Pa_Terminate();
    return err;
}